

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestProgress::testStuff(TestProgress *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QColor *pQVar4;
  QColor local_50;
  ProgressBar p;
  
  QtMWidgets::ProgressBar::ProgressBar(&p,(QWidget *)0x0);
  QColor::QColor(&local_50,red);
  QtMWidgets::ProgressBar::setGrooveColor(&p,&local_50);
  QtMWidgets::ProgressBar::setGrooveHeight(&p,10);
  QColor::QColor(&local_50,green);
  QtMWidgets::ProgressBar::setHighlightColor(&p,&local_50);
  pQVar4 = QtMWidgets::ProgressBar::grooveColor(&p);
  QColor::QColor(&local_50,red);
  bVar1 = (bool)QColor::operator==(pQVar4,&local_50);
  cVar2 = QTest::qVerify(bVar1,"p.grooveColor() == Qt::red","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                         ,0x84);
  if (cVar2 != '\0') {
    iVar3 = QtMWidgets::ProgressBar::grooveHeight(&p);
    cVar2 = QTest::qVerify(iVar3 == 10,"p.grooveHeight() == 10","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                           ,0x85);
    if (cVar2 != '\0') {
      pQVar4 = QtMWidgets::ProgressBar::highlightColor(&p);
      QColor::QColor(&local_50,green);
      bVar1 = (bool)QColor::operator==(pQVar4,&local_50);
      QTest::qVerify(bVar1,"p.highlightColor() == Qt::green","",
                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                     ,0x86);
    }
  }
  QtMWidgets::ProgressBar::~ProgressBar(&p);
  return;
}

Assistant:

void testStuff()
	{
		QtMWidgets::ProgressBar p;

		p.setGrooveColor( Qt::red );
		p.setGrooveHeight( 10 );
		p.setHighlightColor( Qt::green );

		QVERIFY( p.grooveColor() == Qt::red );
		QVERIFY( p.grooveHeight() == 10 );
		QVERIFY( p.highlightColor() == Qt::green );
	}